

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_add2(Curl_hash *h,void *key,size_t key_len,void *p,Curl_hash_elem_dtor dtor)

{
  Curl_hash_element **ppCVar1;
  size_t sVar2;
  size_t sVar3;
  Curl_hash_element *he_00;
  Curl_hash_element **slot;
  Curl_hash_element *he;
  Curl_hash_elem_dtor dtor_local;
  void *p_local;
  size_t key_len_local;
  void *key_local;
  Curl_hash *h_local;
  
  if (h->table == (Curl_hash_element **)0x0) {
    ppCVar1 = (Curl_hash_element **)(*Curl_ccalloc)(h->slots,8);
    h->table = ppCVar1;
    if (h->table == (Curl_hash_element **)0x0) {
      return (void *)0x0;
    }
  }
  ppCVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,h->slots);
  slot = &ppCVar1[sVar2]->next;
  while( true ) {
    if (slot == (Curl_hash_element **)0x0) {
      he_00 = hash_elem_create(key,key_len,p,dtor);
      if (he_00 == (Curl_hash_element *)0x0) {
        h_local = (Curl_hash *)0x0;
      }
      else {
        hash_elem_link(h,ppCVar1 + sVar2,he_00);
        h_local = (Curl_hash *)p;
      }
      return h_local;
    }
    sVar3 = (*h->comp_func)(slot + 4,(size_t)slot[3],key,key_len);
    if (sVar3 != 0) break;
    slot = &(*slot)->next;
  }
  hash_elem_clear_ptr(h,(Curl_hash_element *)slot);
  slot[1] = (Curl_hash_element *)p;
  slot[2] = (Curl_hash_element *)dtor;
  return p;
}

Assistant:

void *Curl_hash_add2(struct Curl_hash *h, void *key, size_t key_len, void *p,
                     Curl_hash_elem_dtor dtor)
{
  struct Curl_hash_element *he, **slot;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(!h->table) {
    h->table = calloc(h->slots, sizeof(struct Curl_hash_element *));
    if(!h->table)
      return NULL; /* OOM */
  }

  slot = CURL_HASH_SLOT_ADDR(h, key, key_len);
  for(he = *slot; he; he = he->next) {
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      /* existing key entry, overwrite by clearing old pointer */
      hash_elem_clear_ptr(h, he);
      he->ptr = (void *)p;
      he->dtor = dtor;
      return p;
    }
  }

  he = hash_elem_create(key, key_len, p, dtor);
  if(!he)
    return NULL; /* OOM */

  hash_elem_link(h, slot, he);
  return p; /* return the new entry */
}